

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read.c
# Opt level: O1

int client_switch_proxy(archive_read_filter *self,uint iindex)

{
  archive_read *paVar1;
  archive_switch_callback *paVar2;
  void *pvVar3;
  code *pcVar4;
  int iVar5;
  int iVar6;
  
  paVar1 = self->archive;
  if ((paVar1->client).cursor == iindex) {
    iVar6 = 0;
  }
  else {
    (paVar1->client).cursor = iindex;
    paVar2 = (paVar1->client).switcher;
    pvVar3 = (paVar1->client).dataset[iindex].data;
    if (paVar2 == (archive_switch_callback *)0x0) {
      pcVar4 = (code *)(paVar1->client).closer;
      iVar5 = 0;
      if (pcVar4 != (code *)0x0) {
        iVar5 = (*pcVar4)(paVar1,self->data);
      }
      self->data = pvVar3;
      pcVar4 = (code *)(self->archive->client).opener;
      iVar6 = 0;
      if (pcVar4 != (code *)0x0) {
        iVar6 = (*pcVar4)(self->archive,pvVar3);
      }
    }
    else {
      iVar5 = (*paVar2)(&paVar1->archive,self->data,pvVar3);
      self->data = pvVar3;
      iVar6 = iVar5;
    }
    if (iVar5 < iVar6) {
      iVar6 = iVar5;
    }
  }
  return iVar6;
}

Assistant:

static int
client_switch_proxy(struct archive_read_filter *self, unsigned int iindex)
{
  int r1 = ARCHIVE_OK, r2 = ARCHIVE_OK;
	void *data2 = NULL;

	/* Don't do anything if already in the specified data node */
	if (self->archive->client.cursor == iindex)
		return (ARCHIVE_OK);

	self->archive->client.cursor = iindex;
	data2 = self->archive->client.dataset[self->archive->client.cursor].data;
	if (self->archive->client.switcher != NULL)
	{
		r1 = r2 = (self->archive->client.switcher)
			((struct archive *)self->archive, self->data, data2);
		self->data = data2;
	}
	else
	{
		/* Attempt to call close and open instead */
		if (self->archive->client.closer != NULL)
			r1 = (self->archive->client.closer)
				((struct archive *)self->archive, self->data);
		self->data = data2;
		r2 = client_open_proxy(self);
	}
	return (r1 < r2) ? r1 : r2;
}